

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t flatcc_builder_create_string(flatcc_builder_t *B,char *s,size_t len)

{
  flatbuffers_uoffset_t fVar1;
  undefined1 local_c0 [8];
  flatcc_iov_state_t iov;
  flatbuffers_uoffset_t length_prefix;
  flatbuffers_uoffset_t s_pad;
  size_t len_local;
  char *s_local;
  flatcc_builder_t *B_local;
  
  if (len < 0x100000000) {
    __flatbuffers_uoffset_write_to_pe(&iov.iov[7].iov_len,(flatbuffers_uoffset_t)len);
    fVar1 = front_pad(B,(flatbuffers_uoffset_t)len + 1,4);
    iov.iov[7].iov_len._4_4_ = fVar1 + 1;
    local_c0 = (undefined1  [8])0x4;
    iov._8_8_ = &iov.iov[7].iov_len;
    iov.iov[0].iov_base = (void *)0x4;
    iov.len._0_4_ = 1;
    if (len != 0) {
      local_c0 = (undefined1  [8])(len + 4);
      iov.len._0_4_ = 2;
      iov.iov[0].iov_len = (size_t)s;
      iov.iov[1].iov_base = (void *)len;
    }
    if (iov.iov[7].iov_len._4_4_ != 0) {
      local_c0 = (undefined1  [8])((ulong)iov.iov[7].iov_len._4_4_ + (long)local_c0);
      iov.iov[(long)(int)iov.len + -1].iov_len = (size_t)"";
      iov.iov[(int)iov.len].iov_base = (void *)(ulong)iov.iov[7].iov_len._4_4_;
      iov.len._0_4_ = (int)iov.len + 1;
    }
    B_local._4_4_ = emit_front(B,(flatcc_iov_state_t *)local_c0);
  }
  else {
    B_local._4_4_ = 0;
  }
  return B_local._4_4_;
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_string(flatcc_builder_t *B, const char *s, size_t len)
{
    uoffset_t s_pad;
    uoffset_t length_prefix;
    iov_state_t iov;

    if (len > max_string_len) {
        return 0;
    }
    write_uoffset(&length_prefix, (uoffset_t)len);
    /* Add 1 for zero termination. */
    s_pad = front_pad(B, (uoffset_t)len + 1, field_size) + 1;
    init_iov();
    push_iov(&length_prefix, field_size);
    push_iov(s, len);
    push_iov(_pad, s_pad);
    return emit_front(B, &iov);
}